

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O3

void mxx::impl::all2all_big<int>(int *msgs,size_t size,int *out,comm *comm)

{
  datatype dt;
  datatype dt_1;
  datatype local_48;
  datatype local_30;
  
  local_30._vptr_datatype = (_func_int **)&PTR__datatype_0017fc80;
  local_30.mpitype = (MPI_Datatype)&ompi_mpi_int;
  local_30.builtin = true;
  datatype::contiguous(&local_48,&local_30,size);
  datatype::~datatype(&local_30);
  MPI_Alltoall(msgs,1,local_48.mpitype,out,1,local_48.mpitype,comm->mpi_comm);
  datatype::~datatype(&local_48);
  return;
}

Assistant:

void all2all_big(const T* msgs, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Alltoall(const_cast<T*>(msgs), 1, dt.type(), out, 1, dt.type(), comm);
}